

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_DrawMasked(void)

{
  seg_t *psVar1;
  line_t_conflict *this;
  bool bVar2;
  drawseg_t **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  code *compare;
  double *pdVar6;
  double dVar7;
  drawseg_t *local_38;
  
  TArray<swrenderer::drawseg_t_*,_swrenderer::drawseg_t_*>::Clear
            ((TArray<swrenderer::drawseg_t_*,_swrenderer::drawseg_t_*> *)&portaldrawsegs);
  ppdVar3 = (drawseg_t **)&ds_p;
  while( true ) {
    local_38 = (drawseg_t *)((long)*ppdVar3 - 0x98);
    if (*ppdVar3 <= firstdrawseg) break;
    psVar1 = local_38->curline;
    ppdVar3 = &local_38;
    if ((psVar1 != (seg_t *)0x0) &&
       (this = psVar1->linedef, ppdVar3 = &local_38, this != (line_t_conflict *)0x0)) {
      bVar2 = line_t::isVisualPortal(this);
      if (((bVar2) || (ppdVar3 = &local_38, this->special == 0xb6)) &&
         (ppdVar3 = &local_38, local_38->curline->sidedef == this->sidedef[0])) {
        TArray<swrenderer::drawseg_t_*,_swrenderer::drawseg_t_*>::Push
                  ((TArray<swrenderer::drawseg_t_*,_swrenderer::drawseg_t_*> *)&portaldrawsegs,
                   &local_38);
        ppdVar3 = &local_38;
      }
    }
  }
  compare = sv_compare;
  if (DrewAVoxel != '\0') {
    compare = sv_compare2d;
  }
  R_SortVisSprites(compare,firstvissprite - vissprites >> 3);
  pdVar5 = (double *)&height_top;
  if (height_top == (double *)0x0) {
    R_DrawMaskedSingle(false);
  }
  else {
    for (pdVar6 = (double *)&height_cur; pdVar6 = (double *)*pdVar6, pdVar6 != (double *)0x0;
        pdVar6 = pdVar6 + 1) {
      dVar7 = *pdVar6;
      if (dVar7 < ViewPos.Z) break;
      fake3D = 1;
      if ((undefined8 *)pdVar6[2] != (undefined8 *)0x0) {
        sclipTop = *(undefined8 *)pdVar6[2];
        dVar7 = *pdVar6;
        fake3D = 3;
      }
      sclipBottom = dVar7;
      R_DrawMaskedSingle(true);
      R_DrawHeightPlanes(*pdVar6);
    }
    fake3D = 10;
    pdVar4 = (double *)&sclipTop;
    pdVar6 = height_top;
    while( true ) {
      *pdVar4 = *pdVar6;
      R_DrawMaskedSingle(true);
      pdVar6 = (double *)*pdVar5;
      if (pdVar6 == (double *)0x0) break;
      if (ViewPos.Z <= *pdVar6) break;
      R_DrawHeightPlanes(*pdVar6);
      fake3D = 9;
      if ((undefined8 *)pdVar6[2] != (undefined8 *)0x0) {
        sclipTop = *(undefined8 *)pdVar6[2];
        fake3D = 0xb;
      }
      pdVar5 = pdVar6 + 2;
      pdVar4 = &sclipBottom;
    }
    R_3D_DeleteHeights();
    fake3D = 0;
  }
  R_DrawPlayerSprites();
  return;
}

Assistant:

static inline void R_CollectPortals()
{
	// This function collects all drawsegs that may be of interest to R_ClipSpriteColumnWithPortals 
	// Having that function over the entire list of drawsegs can break down performance quite drastically.
	// This is doing the costly stuff only once so that R_ClipSpriteColumnWithPortals can 
	// a) exit early if no relevant info is found and
	// b) skip most of the collected drawsegs which have no portal attached.
	portaldrawsegs.Clear();
	for (drawseg_t* seg = ds_p; seg-- > firstdrawseg; ) // copied code from killough below
	{
		// I don't know what makes this happen (some old top-down portal code or possibly skybox code? something adds null lines...)
		// crashes at the first frame of the first map of Action2.wad
		if (!seg->curline) continue;

		line_t* line = seg->curline->linedef;
		// ignore minisegs from GL nodes.
		if (!line) continue;

		// check if this line will clip sprites to itself
		if (!line->isVisualPortal() && line->special != Line_Mirror)
			continue;

		// don't clip sprites with portal's back side (it's transparent)
		if (seg->curline->sidedef != line->sidedef[0])
			continue;

		portaldrawsegs.Push(seg);
	}
}